

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CreateDefaultArgumentFunctionWrappers(ExpressionContext *ctx)

{
  FunctionData *function_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  FunctionData **ppFVar4;
  ArgumentData *pAVar5;
  ExprBase *node;
  ExprFunctionAccess *pEVar6;
  InplaceStr IVar7;
  ExprFunctionAccess *expr;
  ExprBase *access;
  FunctionData **valueFunction;
  undefined1 auStack_80 [8];
  InplaceStr functionName;
  ExprBase *value;
  ArgumentData *argument;
  uint k;
  FunctionData *function;
  undefined1 local_48 [4];
  uint i;
  DirectChainedMap<FunctionData_*> valueFunctions;
  TraceScope traceScope;
  ExpressionContext *ctx_local;
  
  if ((CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token)
     , iVar2 != 0)) {
    CreateDefaultArgumentFunctionWrappers::token =
         NULLC::TraceGetToken("analyze","CreateDefaultArgumentFunctionWrappers");
    __cxa_guard_release(&CreateDefaultArgumentFunctionWrappers(ExpressionContext&)::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&valueFunctions.allocator,CreateDefaultArgumentFunctionWrappers::token);
  DirectChainedMap<FunctionData_*>::DirectChainedMap
            ((DirectChainedMap<FunctionData_*> *)local_48,ctx->allocator);
  function._4_4_ = 0;
  do {
    uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
    if (uVar3 <= function._4_4_) {
      DirectChainedMap<FunctionData_*>::~DirectChainedMap
                ((DirectChainedMap<FunctionData_*> *)local_48);
      NULLC::TraceScope::~TraceScope((TraceScope *)&valueFunctions.allocator);
      return;
    }
    ppFVar4 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,function._4_4_);
    function_00 = *ppFVar4;
    if ((function_00->importModule == (ModuleData *)0x0) &&
       (((function_00->scope == ctx->globalScope ||
         (function_00->scope->ownerType != (TypeBase *)0x0)) && ((function_00->isHidden & 1U) == 0))
       )) {
      for (argument._4_4_ = 0; uVar3 = SmallArray<ArgumentData,_4U>::size(&function_00->arguments),
          argument._4_4_ < uVar3; argument._4_4_ = argument._4_4_ + 1) {
        pAVar5 = SmallArray<ArgumentData,_4U>::operator[](&function_00->arguments,argument._4_4_);
        if (pAVar5->value != (ExprBase *)0x0) {
          if (pAVar5->valueFunction != (FunctionData *)0x0) {
            __assert_fail("argument.valueFunction == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x3446,"void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)")
            ;
          }
          functionName.end = (char *)pAVar5->value;
          bVar1 = isType<TypeError>(((ExprBase *)functionName.end)->type);
          if (!bVar1) {
            bVar1 = isType<TypeFunctionSet>(*(TypeBase **)(functionName.end + 0x18));
            if (bVar1) {
              functionName.end =
                   (char *)CreateCast(ctx,pAVar5->source,pAVar5->value,pAVar5->type,true);
            }
            IVar7 = GetDefaultArgumentWrapperFunctionName(ctx,function_00,pAVar5->name->name);
            functionName.begin = IVar7.end;
            auStack_80 = (undefined1  [8])IVar7.begin;
            uVar3 = InplaceStr::hash((InplaceStr *)auStack_80);
            ppFVar4 = DirectChainedMap<FunctionData_*>::find
                                ((DirectChainedMap<FunctionData_*> *)local_48,uVar3);
            if (ppFVar4 == (FunctionData **)0x0) {
              IVar7.end = functionName.begin;
              IVar7.begin = (char *)auStack_80;
              node = CreateValueFunctionWrapper
                               (ctx,pAVar5->source,(SynBase *)0x0,(ExprBase *)functionName.end,IVar7
                               );
              bVar1 = isType<ExprError>(node);
              if (!bVar1) {
                bVar1 = isType<ExprFunctionAccess>(node);
                if (!bVar1) {
                  __assert_fail("isType<ExprFunctionAccess>(access)",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                                ,0x345d,
                                "void CreateDefaultArgumentFunctionWrappers(ExpressionContext &)");
                }
                pEVar6 = getType<ExprFunctionAccess>(node);
                if (pEVar6 != (ExprFunctionAccess *)0x0) {
                  pAVar5->valueFunction = pEVar6->function;
                  uVar3 = InplaceStr::hash((InplaceStr *)auStack_80);
                  DirectChainedMap<FunctionData_*>::insert
                            ((DirectChainedMap<FunctionData_*> *)local_48,uVar3,pEVar6->function);
                }
              }
            }
            else {
              pAVar5->valueFunction = *ppFVar4;
            }
          }
        }
      }
    }
    function._4_4_ = function._4_4_ + 1;
  } while( true );
}

Assistant:

void CreateDefaultArgumentFunctionWrappers(ExpressionContext &ctx)
{
	TRACE_SCOPE("analyze", "CreateDefaultArgumentFunctionWrappers");

	DirectChainedMap<FunctionData*> valueFunctions(ctx.allocator);

	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		if(function->importModule)
			continue;

		// Handle only global visible functions
		if(function->scope != ctx.globalScope && !function->scope->ownerType)
			continue;

		if(function->isHidden)
			continue;

		// Go through all function arguments
		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			if(argument.value)
			{
				assert(argument.valueFunction == NULL);

				ExprBase *value = argument.value;

				if(isType<TypeError>(value->type))
					continue;

				if(isType<TypeFunctionSet>(value->type))
					value = CreateCast(ctx, argument.source, argument.value, argument.type, true);

				InplaceStr functionName = GetDefaultArgumentWrapperFunctionName(ctx, function, argument.name->name);

				if(FunctionData **valueFunction = valueFunctions.find(functionName.hash()))
				{
					argument.valueFunction = *valueFunction;
					continue;
				}

				ExprBase *access = CreateValueFunctionWrapper(ctx, argument.source, NULL, value, functionName);

				if(isType<ExprError>(access))
					continue;

				assert(isType<ExprFunctionAccess>(access));

				if(ExprFunctionAccess *expr = getType<ExprFunctionAccess>(access))
				{
					argument.valueFunction = expr->function;

					valueFunctions.insert(functionName.hash(), expr->function);
				}
			}
		}
	}
}